

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O1

int Abc_NtkDemiter(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *__ptr_00;
  long lVar6;
  ulong uVar7;
  char *__s;
  uint uVar8;
  Abc_Obj_t *pNodeB;
  Abc_Obj_t *pNodeA;
  Abc_Obj_t *pNodeC;
  Abc_Obj_t *local_40;
  Abc_Obj_t *local_38;
  Abc_Obj_t *local_30;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x442,"int Abc_NtkDemiter(Abc_Ntk_t *)");
  }
  if (pNtk->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x443,"int Abc_NtkDemiter(Abc_Ntk_t *)");
  }
  plVar2 = (long *)*pNtk->vPos->pArray;
  iVar3 = Abc_NodeIsExorType(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                              (long)*(int *)plVar2[4] * 8));
  if (iVar3 != 0) {
    if (0 < pNtk->vPos->nSize) {
      plVar2 = (long *)*pNtk->vPos->pArray;
      local_30 = Abc_NodeRecognizeMux
                           (*(Abc_Obj_t **)
                             (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8
                             ),&local_38,&local_40);
      if (1 < ((ulong)local_40 ^ (ulong)local_38)) {
        __assert_fail("Abc_ObjRegular(pNodeA) == Abc_ObjRegular(pNodeB)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                      ,0x44a,"int Abc_NtkDemiter(Abc_Ntk_t *)");
      }
      if (0 < pNtk->vPos->nSize) {
        if ((*(byte *)((long)*pNtk->vPos->pArray + 0x15) & 4) != 0) {
          local_38 = (Abc_Obj_t *)((ulong)local_38 ^ 1);
          local_40 = (Abc_Obj_t *)((ulong)local_40 ^ 1);
        }
        pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
        Abc_ObjAddFanin(pAVar5,local_30);
        uVar8 = 0;
        Abc_ObjAssignName(pAVar5,"addOut1",(char *)0x0);
        pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
        Abc_ObjAddFanin(pAVar5,local_40);
        Abc_ObjAssignName(pAVar5,"addOut2",(char *)0x0);
        local_40 = (Abc_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
        __ptr = Abc_NtkDfsNodes(pNtk,&local_30,1);
        __ptr_00 = Abc_NtkDfsNodes(pNtk,&local_40,1);
        if (0 < __ptr->nSize) {
          lVar6 = 0;
          do {
            puVar1 = (uint *)((long)__ptr->pArray[lVar6] + 0x14);
            *puVar1 = *puVar1 | 0x10;
            lVar6 = lVar6 + 1;
          } while (lVar6 < __ptr->nSize);
        }
        if (0 < (long)__ptr_00->nSize) {
          lVar6 = 0;
          uVar8 = 0;
          do {
            uVar8 = uVar8 + ((*(uint *)((long)__ptr_00->pArray[lVar6] + 0x14) >> 4 & 1) != 0);
            lVar6 = lVar6 + 1;
          } while (__ptr_00->nSize != lVar6);
        }
        uVar7 = (ulong)(uint)__ptr->nSize;
        if (0 < __ptr->nSize) {
          lVar6 = 0;
          do {
            puVar1 = (uint *)((long)__ptr->pArray[lVar6] + 0x14);
            *puVar1 = *puVar1 & 0xffffffef;
            lVar6 = lVar6 + 1;
            uVar7 = (ulong)__ptr->nSize;
          } while (lVar6 < (long)uVar7);
        }
        printf("First cone = %6d.  Second cone = %6d.  Common = %6d.\n",uVar7,
               (ulong)(uint)__ptr_00->nSize,(ulong)uVar8);
        if (__ptr->pArray != (void **)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (void **)0x0;
        }
        if (__ptr != (Vec_Ptr_t *)0x0) {
          free(__ptr);
        }
        if (__ptr_00->pArray != (void **)0x0) {
          free(__ptr_00->pArray);
          __ptr_00->pArray = (void **)0x0;
        }
        if (__ptr_00 != (Vec_Ptr_t *)0x0) {
          free(__ptr_00);
        }
        Abc_NtkOrderCisCos(pNtk);
        iVar4 = Abc_NtkCheck(pNtk);
        iVar3 = 1;
        if (iVar4 != 0) {
          return 1;
        }
        __s = "Abc_NtkDemiter: The network check has failed.";
        goto LAB_0027edbc;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar3 = 0;
  __s = "The root of the miter is not an EXOR gate.";
LAB_0027edbc:
  puts(__s);
  return iVar3;
}

Assistant:

int Abc_NtkDemiter( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNodeC, * pNodeA, * pNodeB, * pNode;
    Abc_Obj_t * pPoNew;
    Vec_Ptr_t * vNodes1, * vNodes2;
    int nCommon, i;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    if ( !Abc_NodeIsExorType(Abc_ObjFanin0(Abc_NtkPo(pNtk,0))) )
    {
        printf( "The root of the miter is not an EXOR gate.\n" );
        return 0;
    }
    pNodeC = Abc_NodeRecognizeMux( Abc_ObjFanin0(Abc_NtkPo(pNtk,0)), &pNodeA, &pNodeB );
    assert( Abc_ObjRegular(pNodeA) == Abc_ObjRegular(pNodeB) );
    if ( Abc_ObjFaninC0(Abc_NtkPo(pNtk,0)) )
    {
        pNodeA = Abc_ObjNot(pNodeA);
        pNodeB = Abc_ObjNot(pNodeB);
    }

    // add the PO corresponding to control input
    pPoNew = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pPoNew, pNodeC );
    Abc_ObjAssignName( pPoNew, "addOut1", NULL );

    // add the PO corresponding to other input
    pPoNew = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pPoNew, pNodeB );
    Abc_ObjAssignName( pPoNew, "addOut2", NULL );

    // mark the nodes in the first cone
    pNodeB = Abc_ObjRegular(pNodeB);
    vNodes1 = Abc_NtkDfsNodes( pNtk, &pNodeC, 1 );
    vNodes2 = Abc_NtkDfsNodes( pNtk, &pNodeB, 1 );

    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes1, pNode, i )
        pNode->fMarkA = 1;
    nCommon = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes2, pNode, i )
        nCommon += pNode->fMarkA;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes1, pNode, i )
        pNode->fMarkA = 0;

    printf( "First cone = %6d.  Second cone = %6d.  Common = %6d.\n", vNodes1->nSize, vNodes2->nSize, nCommon );
    Vec_PtrFree( vNodes1 );
    Vec_PtrFree( vNodes2 );

    // reorder the latches
    Abc_NtkOrderCisCos( pNtk );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
        printf( "Abc_NtkDemiter: The network check has failed.\n" );
    return 1;
}